

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfriendlist.cc
# Opt level: O3

void __thiscall bdFriendList::bdFriendList(bdFriendList *this,bdNodeId *ownId)

{
  _Rb_tree_header *p_Var1;
  bdId tmpId;
  bdId local_34;
  
  p_Var1 = &(this->mPeers)._M_t._M_impl.super__Rb_tree_header;
  (this->mPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mPeers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mPeers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bdId::bdId(&local_34);
  local_34.id.data._16_4_ = *(undefined4 *)(ownId->data + 0x10);
  local_34.id.data._0_8_ = *(undefined8 *)ownId->data;
  local_34.id.data._8_8_ = *(undefined8 *)(ownId->data + 8);
  updatePeer(this,&local_34,0x100000);
  return;
}

Assistant:

bdFriendList::bdFriendList(const bdNodeId *ownId) {
	bdId tmpId;
	tmpId.id = *ownId;
	updatePeer(&tmpId, BD_FRIEND_ENTRY_SELF);
}